

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printUImm12Offset2(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  SStream *unaff_retaddr;
  uint in_stack_00000008;
  
  printUImm12Offset((MCInst *)O,Scale,in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

static void printUImm12Offset2(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	printUImm12Offset(MI, OpNum, Scale, O);
}